

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O1

bool __thiscall benchmark::CSVReporter::ReportContext(CSVReporter *this,Context *context)

{
  char *pcVar1;
  ostream *poVar2;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Run on (",8);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,context->num_cpus);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," X ",3);
  poVar2 = std::ostream::_M_insert<double>(context->mhz_per_cpu);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," MHz CPU ",9);
  pcVar1 = ".[\\*^$\n";
  if (1 < context->num_cpus) {
    pcVar1 = "\"%s\": %s";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar1 + 7,(ulong)(1 < context->num_cpus));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  LocalDateTimeString_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  if (context->cpu_scaling_enabled == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incure extra overhead.\n"
               ,0x78);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "***WARNING*** Library was built as DEBUG. Timings may be affected.\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "name,iterations,real_time,cpu_time,bytes_per_second,items_per_second,label\n",0x4b);
  return true;
}

Assistant:

bool CSVReporter::ReportContext(const Context& context) {
  std::cerr << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  std::cerr << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    std::cerr << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incure extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  std::cerr << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif
  std::cout << "name,iterations,real_time,cpu_time,bytes_per_second,"
               "items_per_second,label\n";
  return true;
}